

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ConstraintSet::calcForces
          (ConstraintSet *this,uint groupIndex,Model *model,VectorNd *Q,VectorNd *QDot,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodyIdsUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          bool resolveAllInRootFrame,bool updKin)

{
  element_type *peVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  VectorNd *in_stack_00000368;
  VectorNd *in_stack_00000370;
  VectorNd *in_stack_00000378;
  Model *in_stack_00000380;
  
  if ((in_stack_00000020 & 1) != 0) {
    UpdateKinematicsCustom(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368);
  }
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
  ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                *)(in_RDI + 200),(ulong)in_ESI);
  peVar1 = std::
           __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6e8f7b);
  (*peVar1->_vptr_Constraint[5])
            (0,peVar1,in_RDX,in_RCX,in_R8,in_RDI + 0x198,in_RDI + 0x130,in_R9,in_stack_00000008,
             in_stack_00000010,in_RDI + 0x620,(uint)(in_stack_00000018 & 1),
             (uint)(in_stack_00000020 & 1));
  return;
}

Assistant:

void ConstraintSet::calcForces(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  std::vector< unsigned int > &constraintBodyIdsUpd,
  std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
  std::vector< Math::SpatialVector > &constraintForcesUpd,
  bool resolveAllInRootFrame,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  constraints[groupIndex]->calcConstraintForces(model,0.,Q,QDot,G,force,
      constraintBodyIdsUpd,
      constraintBodyFramesUpd,
      constraintForcesUpd,
      cache,
      resolveAllInRootFrame,
      updKin);
}